

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo_unittest.cpp
# Opt level: O2

void __thiscall
cesl_mpsc_llfifo_unittest_push_beyond_full_Test::cesl_mpsc_llfifo_unittest_push_beyond_full_Test
          (cesl_mpsc_llfifo_unittest_push_beyond_full_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00144a98;
  return;
}

Assistant:

TEST(cesl_mpsc_llfifo_unittest, push_beyond_full)
{
    cesl_mpsc_llfifo_create(&my_fifo_g, my_fifo_elem_max_size, my_fifo_elems_max_count, (char*)my_fifo_buffer_g);
    test_cesl_mpsc_llfifo_push("first");
    test_cesl_mpsc_llfifo_push("second");
    test_cesl_mpsc_llfifo_push("third");
    EXPECT_EQ(3, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(1, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_empty(&my_fifo_g));
    EXPECT_EQ(std::string("first"), cesl_mpsc_llfifo_front(&my_fifo_g));

    // Beyond
    auto ok = test_cesl_mpsc_llfifo_push("fourth");
    EXPECT_EQ(0, ok);
    EXPECT_EQ(3, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(1, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_empty(&my_fifo_g));
    EXPECT_EQ(std::string("first"), cesl_mpsc_llfifo_front(&my_fifo_g));
}